

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::visitElse(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this)

{
  undefined1 *puVar1;
  size_t sVar2;
  size_t sVar3;
  ScopeCtx *pSVar4;
  mapped_type *this_00;
  long lVar5;
  ScopeCtx *pSVar6;
  undefined8 *puVar7;
  byte bVar8;
  undefined1 local_1d0 [8];
  ScopeCtx scope;
  Result<wasm::Expression_*> expr;
  Result<wasm::Expression_*> _val;
  void *local_a0;
  long local_90;
  void *local_88;
  long local_78;
  void *local_70;
  long local_60;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  bVar8 = 0;
  pSVar4 = getScope(this);
  pSVar6 = pSVar4;
  puVar7 = (undefined8 *)local_1d0;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *(undefined8 *)
               &(pSVar6->scope).
                super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                .
                super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                .
                super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                .
                super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                .
                super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                .
                super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
    ;
    pSVar6 = (ScopeCtx *)((long)pSVar6 + (ulong)bVar8 * -0x10 + 8);
    puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
  }
  scope.inputType.id._0_4_ = pSVar4->inputLocal;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&scope.inputLocal,
             &pSVar4->outputLocals);
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
             &scope.outputLocals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&pSVar4->outputLabels);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
             &scope.outputLabels.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,&pSVar4->exprStack);
  scope.exprStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = *(undefined4 *)&pSVar4->unreachable;
  scope.exprStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = *(undefined4 *)&pSVar4->field_0xa4;
  scope._160_4_ = *(undefined4 *)&pSVar4->startPos;
  scope._164_4_ = *(undefined4 *)((long)&pSVar4->startPos + 4);
  if (local_1d0 == (undefined1  [8])0x0 ||
      scope.scope.
      super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      .
      super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      .
      super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      .
      super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      .
      super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      .
      super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
      ._M_u._16_1_ != '\x03') {
    puVar1 = (undefined1 *)
             ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 8);
    expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ = puVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               ((long)&expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),
               "unexpected else","");
    puVar7 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar7;
    if ((undefined1 *)
        expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ == puVar1) {
      *puVar7 = CONCAT71(_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._9_7_,
                         _val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           _val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
           expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           CONCAT71(_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._9_7_,
                    _val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_);
    }
    ((_Uninitialized<wasm::Expression_*,_true> *)
    ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8))->_M_storage =
         (Expression *)
         _val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
         super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage;
    _val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first._M_storage =
         (_Uninitialized<wasm::Expression_*,_true>)(Expression *)0x0;
    _val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ = puVar1;
  }
  else {
    finishScope((Result<wasm::Expression_*> *)&scope.startPos,this,(Block *)0x0);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)
               ((long)&expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),
               (_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)&scope.startPos);
    if (_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._24_1_ == '\x01') {
      local_48 = &local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,
                 expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_,
                 (long)_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_u._M_first.
                       _M_storage +
                 expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_);
      puVar7 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar7;
      if (local_48 == &local_38) {
        *puVar7 = CONCAT71(uStack_37,local_38);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_30;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_48;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             CONCAT71(uStack_37,local_38);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_40;
      local_40 = 0;
      local_38 = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      local_48 = &local_38;
      std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                        ((long)&expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)
                        ((long)&expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
      *(size_t *)((long)local_1d0 + 0x18) = scope.startPos;
      if ((this->binaryPos != (size_t *)0x0) && (this->func != (Function *)0x0)) {
        sVar2 = this->lastBinaryPos;
        sVar3 = this->codeSectionOffset;
        expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_8_ = local_1d0;
        this_00 = std::__detail::
                  _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->func->delimiterLocations,
                               (key_type *)
                               ((long)&expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20)
                              );
        if (((long)(this_00->super_SmallVector<unsigned_int,_1UL>).flexible.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this_00->super_SmallVector<unsigned_int,_1UL>).flexible.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2) +
            (this_00->super_SmallVector<unsigned_int,_1UL>).usedFixed == 0) {
          ZeroInitSmallVector<unsigned_int,_1UL>::resize(this_00,1);
        }
        (this_00->super_SmallVector<unsigned_int,_1UL>).fixed._M_elems[0] = (int)sVar2 - (int)sVar3;
      }
      ScopeCtx::makeElse((ScopeCtx *)
                         ((long)&expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),
                         (ScopeCtx *)local_1d0);
      pushScope(__return_storage_ptr__,this,
                (ScopeCtx *)
                ((long)&expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
      if (local_70 != (void *)0x0) {
        operator_delete(local_70,local_60 - (long)local_70);
      }
      if (local_88 != (void *)0x0) {
        operator_delete(local_88,local_78 - (long)local_88);
      }
      if (local_a0 != (void *)0x0) {
        operator_delete(local_a0,local_90 - (long)local_a0);
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)&scope.startPos);
  }
  if (scope.outputLabels.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(scope.outputLabels.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)scope.exprStack.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)scope.outputLabels.
                          super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (scope.outputLocals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(scope.outputLocals.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)scope.outputLabels.
                          super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)scope.outputLocals.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (scope._80_8_ != 0) {
    operator_delete((void *)scope._80_8_,
                    (long)scope.outputLocals.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - scope._80_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::visitElse() {
  auto scope = getScope();
  auto* iff = scope.getIf();
  if (!iff) {
    return Err{"unexpected else"};
  }
  auto expr = finishScope();
  CHECK_ERR(expr);
  iff->ifTrue = *expr;

  if (binaryPos && func) {
    func->delimiterLocations[iff][BinaryLocations::Else] =
      lastBinaryPos - codeSectionOffset;
  }

  return pushScope(ScopeCtx::makeElse(std::move(scope)));
}